

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::WireFormat::MessageSetParser::ParseElement
          (MessageSetParser *this,char *ptr,ParseContext *ctx)

{
  Message *pMVar1;
  Reflection *pRVar2;
  uint uVar3;
  ParseContext *p_00;
  bool bVar4;
  uint32_t uVar5;
  InternalMetadata *this_00;
  Data *pDVar6;
  Descriptor *pDVar7;
  UnknownFieldSet *pUVar8;
  char *pcVar9;
  ParseContext *p_01;
  size_t extraout_RDX;
  Reflection *in_R8;
  string_view val;
  MessageLite *local_1b0;
  FieldDescriptor *pFStack_128;
  int32_t size_1;
  FieldDescriptor *field_1;
  int32_t size;
  ParseContext tmp_ctx;
  char *p;
  Message *value;
  FieldDescriptor *local_88;
  FieldDescriptor *field;
  uint local_78 [2];
  uint64_t tmp;
  uint32_t tag;
  uint local_5c;
  undefined1 local_58 [4];
  uint32_t type_id;
  string payload;
  State state;
  InternalMetadata *metadata;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageSetParser *this_local;
  
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  this_00 = Reflection::MutableInternalMetadata(this->reflection,this->msg);
  payload.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_58);
  local_5c = 0;
  do {
    while( true ) {
      bVar4 = ParseContext::Done(ctx,(char **)&ctx_local);
      p_00 = ctx_local;
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        this_local = (MessageSetParser *)ctx_local;
        goto LAB_005c07f0;
      }
      p_01 = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
      tmp._0_4_ = (uint)*(byte *)&(ctx_local->super_EpsCopyInputStream).limit_end_;
      ctx_local = p_01;
      if ((uint)tmp != 0x10) break;
      ctx_local = (ParseContext *)ParseBigVarint((char *)p_01,(uint64_t *)local_78);
      if ((ctx_local == (ParseContext *)0x0) || (local_78[0] == 0)) {
        this_local = (MessageSetParser *)0x0;
        goto LAB_005c07f0;
      }
      if (payload.field_2._12_4_ == 0) {
        local_5c = local_78[0];
        payload.field_2._12_4_ = 1;
      }
      else if (payload.field_2._12_4_ == 2) {
        local_5c = local_78[0];
        pDVar6 = ParseContext::data(ctx);
        if (pDVar6->pool == (DescriptorPool *)0x0) {
          local_88 = Reflection::FindKnownExtensionByNumber(this->reflection,local_5c);
        }
        else {
          pDVar6 = ParseContext::data(ctx);
          local_88 = DescriptorPool::FindExtensionByNumber(pDVar6->pool,this->descriptor,local_5c);
        }
        if ((local_88 == (FieldDescriptor *)0x0) ||
           (pDVar7 = FieldDescriptor::message_type(local_88), pDVar7 == (Descriptor *)0x0)) {
          uVar3 = local_5c;
          uVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
          pUVar8 = InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                             (this_00);
          val._M_str = (char *)pUVar8;
          val._M_len = extraout_RDX;
          WriteLengthDelimited((internal *)(ulong)uVar3,uVar5,val,(UnknownFieldSet *)in_R8);
        }
        else {
          bVar4 = FieldDescriptor::is_repeated(local_88);
          if (bVar4) {
            pMVar1 = this->msg;
            pRVar2 = this->reflection;
            pDVar6 = ParseContext::data(ctx);
            local_1b0 = &Reflection::AddMessage(pRVar2,pMVar1,local_88,pDVar6->factory)->
                         super_MessageLite;
          }
          else {
            pMVar1 = this->msg;
            pRVar2 = this->reflection;
            pDVar6 = ParseContext::data(ctx);
            local_1b0 = &Reflection::MutableMessage(pRVar2,pMVar1,local_88,pDVar6->factory)->
                         super_MessageLite;
          }
          ParseContext::ParseContext<std::__cxx11::string&>
                    ((ParseContext *)&size,ctx,&tmp_ctx.data_.factory,local_58);
          pcVar9 = MessageLite::_InternalParse
                             (local_1b0,(char *)tmp_ctx.data_.factory,(ParseContext *)&size);
          if ((pcVar9 == (char *)0x0) ||
             (bVar4 = EpsCopyInputStream::EndedAtLimit((EpsCopyInputStream *)&size), !bVar4)) {
            this_local = (MessageSetParser *)0x0;
            goto LAB_005c07f0;
          }
        }
        payload.field_2._12_4_ = 3;
      }
    }
    if ((uint)tmp == 0x1a) {
      if (payload.field_2._12_4_ == 0) {
        uVar5 = ReadSize((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          this_local = (MessageSetParser *)0x0;
          goto LAB_005c07f0;
        }
        ctx_local = (ParseContext *)
                    EpsCopyInputStream::ReadString
                              (&ctx->super_EpsCopyInputStream,(char *)ctx_local,uVar5,
                               (string *)local_58);
        if (ctx_local == (ParseContext *)0x0) {
          this_local = (MessageSetParser *)0x0;
          goto LAB_005c07f0;
        }
        payload.field_2._12_4_ = 2;
      }
      else if (payload.field_2._12_4_ == 1) {
        pFStack_128 = (FieldDescriptor *)0x0;
        bVar4 = Descriptor::IsExtensionNumber(this->descriptor,local_5c);
        if (bVar4) {
          pDVar6 = ParseContext::data(ctx);
          if (pDVar6->pool == (DescriptorPool *)0x0) {
            pFStack_128 = Reflection::FindKnownExtensionByNumber(this->reflection,local_5c);
          }
          else {
            pDVar6 = ParseContext::data(ctx);
            pFStack_128 = DescriptorPool::FindExtensionByNumber
                                    (pDVar6->pool,this->descriptor,local_5c);
          }
        }
        in_R8 = this->reflection;
        ctx_local = (ParseContext *)
                    _InternalParseAndMergeField
                              (this->msg,(char *)ctx_local,ctx,(ulong)local_5c * 8 + 2,in_R8,
                               pFStack_128);
        payload.field_2._12_4_ = 3;
      }
      else {
        uVar5 = ReadSize((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          this_local = (MessageSetParser *)0x0;
          goto LAB_005c07f0;
        }
        ctx_local = (ParseContext *)
                    EpsCopyInputStream::Skip(&ctx->super_EpsCopyInputStream,(char *)ctx_local,uVar5)
        ;
        if (ctx_local == (ParseContext *)0x0) {
          this_local = (MessageSetParser *)0x0;
          goto LAB_005c07f0;
        }
      }
    }
    else {
      ctx_local = (ParseContext *)ReadTag((char *)p_00,(uint32_t *)&tmp,0);
      if (((uint)tmp == 0) || (((uint)tmp & 7) == 4)) {
        EpsCopyInputStream::SetLastTag(&ctx->super_EpsCopyInputStream,(uint)tmp);
        this_local = (MessageSetParser *)ctx_local;
        goto LAB_005c07f0;
      }
      ctx_local = (ParseContext *)UnknownFieldParse((uint)tmp,(string *)0x0,(char *)ctx_local,ctx);
    }
  } while (ctx_local != (ParseContext *)0x0);
  this_local = (MessageSetParser *)0x0;
LAB_005c07f0:
  std::__cxx11::string::~string((string *)local_58);
  return (char *)this_local;
}

Assistant:

const char* ParseElement(const char* ptr, internal::ParseContext* ctx) {
    // Parse a MessageSetItem
    auto metadata = reflection->MutableInternalMetadata(msg);
    enum class State { kNoTag, kHasType, kHasPayload, kDone };
    State state = State::kNoTag;

    std::string payload;
    uint32_t type_id = 0;
    while (!ctx->Done(&ptr)) {
      // We use 64 bit tags in order to allow typeid's that span the whole
      // range of 32 bit numbers.
      uint32_t tag = static_cast<uint8_t>(*ptr++);
      if (tag == WireFormatLite::kMessageSetTypeIdTag) {
        uint64_t tmp;
        ptr = ParseBigVarint(ptr, &tmp);
        // We should fail parsing if type id is 0 after cast to uint32.
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr &&
                                       static_cast<uint32_t>(tmp) != 0);
        if (state == State::kNoTag) {
          type_id = static_cast<uint32_t>(tmp);
          state = State::kHasType;
        } else if (state == State::kHasPayload) {
          type_id = static_cast<uint32_t>(tmp);
          const FieldDescriptor* field;
          if (ctx->data().pool == nullptr) {
            field = reflection->FindKnownExtensionByNumber(type_id);
          } else {
            field =
                ctx->data().pool->FindExtensionByNumber(descriptor, type_id);
          }
          if (field == nullptr || field->message_type() == nullptr) {
            WriteLengthDelimited(
                type_id, payload,
                metadata->mutable_unknown_fields<UnknownFieldSet>());
          } else {
            Message* value =
                field->is_repeated()
                    ? reflection->AddMessage(msg, field, ctx->data().factory)
                    : reflection->MutableMessage(msg, field,
                                                 ctx->data().factory);
            const char* p;
            // We can't use regular parse from string as we have to track
            // proper recursion depth and descriptor pools. Spawn a new
            // ParseContext inheriting those attributes.
            ParseContext tmp_ctx(ParseContext::kSpawn, *ctx, &p, payload);
            GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                           tmp_ctx.EndedAtLimit());
          }
          state = State::kDone;
        }
        continue;
      } else if (tag == WireFormatLite::kMessageSetMessageTag) {
        if (state == State::kNoTag) {
          int32_t size = ReadSize(&ptr);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
          ptr = ctx->ReadString(ptr, size, &payload);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
          state = State::kHasPayload;
        } else if (state == State::kHasType) {
          // We're now parsing the payload
          const FieldDescriptor* field = nullptr;
          if (descriptor->IsExtensionNumber(type_id)) {
            if (ctx->data().pool == nullptr) {
              field = reflection->FindKnownExtensionByNumber(type_id);
            } else {
              field =
                  ctx->data().pool->FindExtensionByNumber(descriptor, type_id);
            }
          }
          ptr = WireFormat::_InternalParseAndMergeField(
              msg, ptr, ctx, static_cast<uint64_t>(type_id) * 8 + 2, reflection,
              field);
          state = State::kDone;
        } else {
          int32_t size = ReadSize(&ptr);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
          ptr = ctx->Skip(ptr, size);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        }
      } else {
        // An unknown field in MessageSetItem.
        ptr = ReadTag(ptr - 1, &tag);
        if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        // Skip field.
        ptr = internal::UnknownFieldParse(
            tag, static_cast<std::string*>(nullptr), ptr, ctx);
      }
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
    return ptr;
  }